

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O3

void __thiscall
LASwriteItemCompressed_RGB14_v4::~LASwriteItemCompressed_RGB14_v4
          (LASwriteItemCompressed_RGB14_v4 *this)

{
  ArithmeticModel *m;
  ArithmeticEncoder *this_00;
  long lVar1;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_0015d688;
  lVar1 = 0;
  do {
    m = *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 6);
    if (m != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,m);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0xe));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x16));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x1e));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x26));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x2e));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x36));
    }
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x100);
  if (this->outstream_RGB != (ByteStreamOutArray *)0x0) {
    (*(this->outstream_RGB->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    this_00 = this->enc_RGB;
    if (this_00 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(this_00);
    }
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

LASwriteItemCompressed_RGB14_v4::~LASwriteItemCompressed_RGB14_v4()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_byte_used)
    {
      enc_RGB->destroySymbolModel(contexts[c].m_byte_used);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_0);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_1);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_2);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_3);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_4);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_5);
    }
  }

  /* destroy all outstreams and encoders */

  if (outstream_RGB)
  {
    delete outstream_RGB;

    delete enc_RGB;
  }
}